

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String __thiscall Bstrlib::String::operator+(String *this,tagbstring *x)

{
  tagbstring *in_RDX;
  uchar *extraout_RDX;
  String SVar1;
  
  if (in_RDX->slen < 0) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x23b,"Failure in + (tagbstring) operator, badly formed tagbstring");
  }
  String(this,(String *)x);
  operator+=(this,in_RDX);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(const tagbstring& x) const
    {
        if (x.slen < 0)    bstringThrow("Failure in + (tagbstring) operator, badly formed tagbstring");
        String retval(*this);
        retval += x;
        return retval;
    }